

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_match(GENERAL_NAME *gen,NAME_CONSTRAINTS *nc)

{
  int iVar1;
  size_t sVar2;
  GENERAL_SUBTREE *pGVar3;
  ulong local_38;
  size_t i;
  int match;
  int r;
  GENERAL_SUBTREE *sub;
  NAME_CONSTRAINTS *nc_local;
  GENERAL_NAME *gen_local;
  
  i._0_4_ = 0;
  for (local_38 = 0; sVar2 = sk_GENERAL_SUBTREE_num(nc->permittedSubtrees), local_38 < sVar2;
      local_38 = local_38 + 1) {
    pGVar3 = sk_GENERAL_SUBTREE_value(nc->permittedSubtrees,local_38);
    if (gen->type == pGVar3->base->type) {
      if ((pGVar3->minimum != (ASN1_INTEGER *)0x0) || (pGVar3->maximum != (ASN1_INTEGER *)0x0)) {
        return 0x31;
      }
      if ((int)i != 2) {
        if ((int)i == 0) {
          i._0_4_ = 1;
        }
        iVar1 = nc_match_single(gen,pGVar3->base);
        if (iVar1 == 0) {
          i._0_4_ = 2;
        }
        else if (iVar1 != 0x2f) {
          return iVar1;
        }
      }
    }
  }
  if ((int)i == 1) {
    gen_local._4_4_ = 0x2f;
  }
  else {
    for (local_38 = 0; sVar2 = sk_GENERAL_SUBTREE_num(nc->excludedSubtrees), local_38 < sVar2;
        local_38 = local_38 + 1) {
      pGVar3 = sk_GENERAL_SUBTREE_value(nc->excludedSubtrees,local_38);
      if (gen->type == pGVar3->base->type) {
        if ((pGVar3->minimum != (ASN1_INTEGER *)0x0) || (pGVar3->maximum != (ASN1_INTEGER *)0x0)) {
          return 0x31;
        }
        iVar1 = nc_match_single(gen,pGVar3->base);
        if (iVar1 == 0) {
          return 0x30;
        }
        if (iVar1 != 0x2f) {
          return iVar1;
        }
      }
    }
    gen_local._4_4_ = 0;
  }
  return gen_local._4_4_;
}

Assistant:

static int nc_match(GENERAL_NAME *gen, NAME_CONSTRAINTS *nc) {
  GENERAL_SUBTREE *sub;
  int r, match = 0;
  size_t i;

  // Permitted subtrees: if any subtrees exist of matching the type at
  // least one subtree must match.

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->permittedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->permittedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }
    // If we already have a match don't bother trying any more
    if (match == 2) {
      continue;
    }
    if (match == 0) {
      match = 1;
    }
    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      match = 2;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  if (match == 1) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  // Excluded subtrees: must not match any of these

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->excludedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->excludedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }

    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      return X509_V_ERR_EXCLUDED_VIOLATION;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  return X509_V_OK;
}